

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_test.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  XMLError XVar2;
  XMLElement *pXVar3;
  XMLElement *el;
  XMLElement *els [2];
  XMLDocument cmds;
  XMLDocument doc;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int_(*)(void_*)>
  local_538;
  XMLDocument local_510;
  XMLDocument local_290;
  
  tinyxml2::XMLDocument::XMLDocument(&local_290,true,PRESERVE_WHITESPACE);
  XVar2 = tinyxml2::XMLDocument::LoadFile(&local_290,"/Users/tkorays/invoker/res/simple_task.xml");
  if (XVar2 == XML_NO_ERROR) {
    pXVar3 = tinyxml2::XMLNode::FirstChildElement(&local_290.super_XMLNode,"proc");
    if (pXVar3 == (XMLElement *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"root node must be a proc",0x18);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
      std::ostream::put(' ');
      std::ostream::flush();
    }
    else {
      tinyxml2::XMLDocument::XMLDocument(&local_510,true,PRESERVE_WHITESPACE);
      XVar2 = tinyxml2::XMLDocument::LoadFile(&local_510,"/Users/tkorays/invoker/res/mycmds.xml");
      if (XVar2 == XML_NO_ERROR) {
        el = tinyxml2::XMLNode::FirstChildElement(&local_510.super_XMLNode,"cmds");
        if (el == (XMLElement *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"root node must b a cmds",0x17);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
          std::ostream::put(' ');
          std::ostream::flush();
        }
        else {
          ivk::proc_add_cmds(el);
          ivk::proc_install();
          paVar1 = &local_538.first.field_2;
          local_538.first._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"cmd_a","");
          local_538.second = cmd_a;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int(*)(void*)>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>>
                      *)ivk::gCmdFuncMap_abi_cxx11_,&local_538);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538.first._M_dataplus._M_p != paVar1) {
            operator_delete(local_538.first._M_dataplus._M_p);
          }
          local_538.first._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"cmd_b","");
          local_538.second = cmd_b;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int(*)(void*)>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>>
                      *)ivk::gCmdFuncMap_abi_cxx11_,&local_538);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538.first._M_dataplus._M_p != paVar1) {
            operator_delete(local_538.first._M_dataplus._M_p);
          }
          local_538.first._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"dump","");
          local_538.second = dump;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int(*)(void*)>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int(*)(void*)>>>
                      *)ivk::gCmdFuncMap_abi_cxx11_,&local_538);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538.first._M_dataplus._M_p != paVar1) {
            operator_delete(local_538.first._M_dataplus._M_p);
          }
          local_538.first._M_string_length = 0;
          local_538.first._M_dataplus._M_p = (pointer)pXVar3;
          ivk::proc_exec(&local_538);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"open file failed",0x10);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
        std::ostream::put(' ');
        std::ostream::flush();
      }
      tinyxml2::XMLDocument::~XMLDocument(&local_510);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Open File Failed",0x10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
  }
  tinyxml2::XMLDocument::~XMLDocument(&local_290);
  return 0;
}

Assistant:

int main(){
    XMLDocument doc;
    XMLError err = XML_NO_ERROR;
    err = doc.LoadFile("/Users/tkorays/invoker/res/simple_task.xml");
    if(err!=XML_NO_ERROR){
        cout<<"Open File Failed"<<endl;
        return 0;
    }

    // 任务入口
    XMLElement* e = doc.FirstChildElement("proc");
    if(e==0){
        cout<<"root node must be a proc"<<endl;
        return 0;
    }

    XMLDocument cmds;
    err = cmds.LoadFile("/Users/tkorays/invoker/res/mycmds.xml");
    if(err!=XML_NO_ERROR){
        cout<<"open file failed"<<endl;
        return 0;
    }
    XMLElement* cmd = cmds.FirstChildElement("cmds");
    if(!cmd){
        cout<<"root node must b a cmds"<<endl;
        return 0;
    }
    proc_add_cmds(cmd);


    proc_install();
    gCmdFuncMap.insert(pair<string,cmd_func>("cmd_a",cmd_a));
    gCmdFuncMap.insert(pair<string,cmd_func>("cmd_b",cmd_b));
    gCmdFuncMap.insert(pair<string,cmd_func>("dump",dump));
    XMLElement* els[2];
    els[0] = e;
    els[1] = 0;
    proc_exec(els);

    return 0;
}